

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-capture.h
# Opt level: O1

void __thiscall
capture_thread::ThreadCapture<LogText>::AutoThreadCrosser::ReconstructContextAndCall
          (AutoThreadCrosser *this,function<void_()> *call,ReverseScope *reverse_scope)

{
  undefined8 uVar1;
  ThreadCrosser *pTVar2;
  long in_FS_OFFSET;
  
  uVar1 = *(undefined8 *)(in_FS_OFFSET + -0x10);
  *(LogText **)(in_FS_OFFSET + -0x10) = (this->capture_to_).current_;
  if (reverse_scope->previous == (ReverseScope *)0x0) {
    pTVar2 = ThreadCrosser::GetCurrent();
    ThreadCrosser::SetCurrent((this->cross_with_).current_);
    if ((call->super__Function_base)._M_manager == (_Manager_type)0x0) {
      __assert_fail("call",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/include/thread-capture.h"
                    ,0xd0,
                    "virtual void capture_thread::ThreadCapture<LogText>::AutoThreadCrosser::ReconstructContextAndCall(const std::function<void ()> &, const ReverseScope &) const [Type = LogText]"
                   );
    }
    (*call->_M_invoker)((_Any_data *)call);
    ThreadCrosser::SetCurrent(pTVar2);
  }
  else {
    pTVar2 = reverse_scope->previous->current;
    if (pTVar2 == (ThreadCrosser *)0x0) {
      __assert_fail("current",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/include/thread-capture.h"
                    ,200,
                    "virtual void capture_thread::ThreadCapture<LogText>::AutoThreadCrosser::ReconstructContextAndCall(const std::function<void ()> &, const ReverseScope &) const [Type = LogText]"
                   );
    }
    (*pTVar2->_vptr_ThreadCrosser[3])(pTVar2,call);
  }
  *(undefined8 *)(in_FS_OFFSET + -0x10) = uVar1;
  return;
}

Assistant:

void ThreadCapture<Type>::AutoThreadCrosser::ReconstructContextAndCall(
    const std::function<void()>& call,
    const ReverseScope& reverse_scope) const {
  // Makes the ThreadCapture available in this scope so that it overrides the
  // default behavior of instrumentation calls made in call.
  const CrossThreads capture(capture_to_);
  if (reverse_scope.previous) {
    const auto current = reverse_scope.previous->current;
    assert(current);
    if (current) {
      current->ReconstructContextAndCall(call, *reverse_scope.previous);
    }
  } else {
    // Makes the ThreadCrosser available in this scope so that call itself can
    // cross threads again.
    const DelegateCrosser crosser(cross_with_);
    assert(call);
    if (call) {
      call();
    }
  }
}